

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  char **ppcVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  OutputLogger submodule_out;
  string top_dir;
  char *git_submodule [5];
  OutputLogger submodule_err;
  OutputLogger local_e8;
  string local_a8;
  pointer local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined8 local_68;
  OutputLogger local_60;
  
  bVar3 = UpdateInternal(this);
  if (bVar3) {
    FindTopDir_abi_cxx11_(&local_a8,this);
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    uVar4 = GetGitVersion(this);
    if (uVar4 < 0xa1d1c8) {
      ppcVar1 = &local_e8.super_LineParser.Prefix;
      local_e8.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)ppcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      std::__cxx11::string::append((char *)&local_e8);
      bVar3 = cmsys::SystemTools::FileExists
                        ((char *)local_e8.super_LineParser.super_OutputParser._vptr_OutputParser);
      if (local_e8.super_LineParser.super_OutputParser._vptr_OutputParser != (_func_int **)ppcVar1)
      {
        operator_delete(local_e8.super_LineParser.super_OutputParser._vptr_OutputParser,
                        (ulong)(local_e8.super_LineParser.Prefix + 1));
      }
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                   "Git < 1.6.5.0 cannot update submodules recursively\n",0x33);
      }
      local_70 = (char *)0x0;
    }
    else {
      local_70 = "--recursive";
    }
    local_80 = "submodule";
    local_78 = "update";
    local_68 = 0;
    local_88 = pcVar2;
    cmProcessTools::OutputLogger::OutputLogger
              (&local_e8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_60,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-err> ");
    bVar3 = cmCTestVC::RunChild((cmCTestVC *)this,&local_88,(OutputParser *)&local_e8,
                                (OutputParser *)&local_60,local_a8._M_dataplus._M_p);
    local_60.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_006cf560;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.super_LineParser.Line._M_dataplus._M_p !=
        &local_60.super_LineParser.Line.field_2) {
      operator_delete(local_60.super_LineParser.Line._M_dataplus._M_p,
                      local_60.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_e8.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_006cf560;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.super_LineParser.Line._M_dataplus._M_p !=
        &local_e8.super_LineParser.Line.field_2) {
      operator_delete(local_e8.super_LineParser.Line._M_dataplus._M_p,
                      local_e8.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if(!this->UpdateInternal())
    {
    return false;
    }

  std::string top_dir = this->FindTopDir();
  const char* git = this->CommandLineTool.c_str();
  const char* recursive = "--recursive";

  // Git < 1.6.5.0 did not support --recursive
  if(this->GetGitVersion() < cmCTestGITVersion(1,6,5,0))
    {
    recursive = 0;
    // No need to require >= 1.6.5.0 if there are no submodules.
    if(cmSystemTools::FileExists((top_dir + "/.gitmodules").c_str()))
      {
      this->Log << "Git < 1.6.5.0 cannot update submodules recursively\n";
      }
    }

  char const* git_submodule[] = {git, "submodule", "update", recursive, 0};
  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir.c_str());
}